

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O3

ABC_UINT64_T Kit_PlaToTruth6(char *pSop,int nVars)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  
  if (6 < nVars) {
    __assert_fail("nVars < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                  ,0x1c8,"ABC_UINT64_T Kit_PlaToTruth6(char *, int)");
  }
  iVar3 = 0;
  iVar2 = 0;
  if (0 < nVars) {
    iVar2 = nVars;
  }
  uVar4 = 0;
  do {
    if (nVars < 1) {
      uVar5 = 0xffffffffffffffff;
      iVar6 = iVar3;
    }
    else {
      pcVar7 = pSop + iVar3;
      iVar6 = iVar3 + nVars;
      uVar5 = 0xffffffffffffffff;
      lVar8 = 0;
      do {
        cVar1 = *pcVar7;
        if (cVar1 != '-') {
          if (cVar1 == '0') {
            uVar5 = uVar5 & ~*(ulong *)((long)Kit_PlaToTruth6::Truth + lVar8);
          }
          else {
            if (cVar1 != '1') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                            ,0x1d2,"ABC_UINT64_T Kit_PlaToTruth6(char *, int)");
            }
            uVar5 = uVar5 & *(ulong *)((long)Kit_PlaToTruth6::Truth + lVar8);
          }
        }
        lVar8 = lVar8 + 8;
        pcVar7 = pcVar7 + 1;
      } while ((ulong)(uint)nVars << 3 != lVar8);
    }
    if (pSop[iVar6] != ' ') {
      __assert_fail("pSop[lit] == \' \'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                    ,0x1d5,"ABC_UINT64_T Kit_PlaToTruth6(char *, int)");
    }
    if (pSop[(long)iVar6 + 2] != '\n') {
      __assert_fail("pSop[lit] == \'\\n\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                    ,0x1d8,"ABC_UINT64_T Kit_PlaToTruth6(char *, int)");
    }
    uVar4 = uVar4 | uVar5;
    iVar3 = iVar3 + iVar2 + 3;
  } while (pSop[iVar3] != '\0');
  iVar2 = Kit_PlaIsComplement(pSop);
  return uVar4 ^ (long)-iVar2;
}

Assistant:

ABC_UINT64_T Kit_PlaToTruth6( char * pSop, int nVars )
{
    static ABC_UINT64_T Truth[8] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000),
        ABC_CONST(0x0000000000000000),
        ABC_CONST(0xFFFFFFFFFFFFFFFF)
    };
    ABC_UINT64_T valueAnd, valueOr = Truth[6];
    int v, lit = 0;
    assert( nVars < 7 );
    do {
        valueAnd = Truth[7];
        for ( v = 0; v < nVars; v++, lit++ )
        {
            if ( pSop[lit] == '1' )
                valueAnd &=  Truth[v];
            else if ( pSop[lit] == '0' )
                valueAnd &= ~Truth[v];
            else if ( pSop[lit] != '-' )
                assert( 0 );
        }
        valueOr |= valueAnd;
        assert( pSop[lit] == ' ' );
        lit++;
        lit++;
        assert( pSop[lit] == '\n' );
        lit++;
    } while ( pSop[lit] );
    if ( Kit_PlaIsComplement(pSop) )
        valueOr = ~valueOr;
    return valueOr;
}